

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
memory<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Index IVar2;
  Name *pNVar3;
  Err *pEVar4;
  Ok *pOVar5;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar6;
  ImportNames *pIVar7;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_409;
  Err local_408;
  Err *local_3e8;
  Err *err_5;
  Result<wasm::WATParser::Ok> _val_5;
  Err *err_4;
  undefined1 local_378 [8];
  Result<wasm::WATParser::Ok> _val_4;
  string local_348;
  Err local_328;
  Err local_308;
  Err *local_2e8;
  Err *err_3;
  Result<wasm::WATParser::Ok> _val_3;
  Result<wasm::WATParser::Ok> type;
  Type local_288;
  Ok local_27a;
  allocator<char> local_279;
  string local_278;
  Err local_258;
  Err local_238;
  Err *local_218;
  Err *err_2;
  Result<wasm::WATParser::Ok> _val_2;
  Result<wasm::WATParser::Ok> datastr;
  string local_1b8;
  Err local_198;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  optional<wasm::WATParser::Ok> local_164;
  optional<wasm::WATParser::Ok> local_162;
  undefined1 local_160 [4];
  optional<wasm::WATParser::Ok> data;
  optional<wasm::WATParser::Ok> mtype;
  Err *err_1;
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  Index pos;
  ParseModuleTypesCtx *ctx_local;
  
  IVar2 = ParseInput::getPos(&ctx->in);
  expected = sv("memory",6);
  bVar1 = ParseInput::takeSExprStart(&ctx->in,expected);
  if (!bVar1) {
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  ParseInput::takeID((optional<wasm::Name> *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                             .super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> +
                     0x20),&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                             .super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> +
                     0x20));
  if (bVar1) {
    pNVar3 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                        + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    WATParser::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    WATParser::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar1) goto LAB_01d21e5c;
  inlineImport((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20),&ctx->in);
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20));
  pEVar4 = MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::getErr
                     ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)&err_1);
  if (pEVar4 != (Err *)0x0) {
    WATParser::Err::Err((Err *)local_160,pEVar4);
    MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_160);
    WATParser::Err::~Err((Err *)local_160);
  }
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)&err_1);
  if (pEVar4 == (Err *)0x0) {
    std::optional<wasm::WATParser::Ok>::optional(&local_162);
    std::optional<wasm::WATParser::Ok>::optional(&local_164);
    local_178 = sv("data",4);
    bVar1 = ParseInput::takeSExprStart(&ctx->in,local_178);
    if (bVar1) {
      bVar1 = WATParser::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_1.val.
                                 super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                         + 0x20));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"imported memories cannot have inline data",
                   (allocator<char> *)
                   ((long)&datastr.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x27)
                  );
        ParseInput::err(&local_198,&ctx->in,&local_1b8);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_198);
        WATParser::Err::~Err(&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&datastr.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x27)
                  );
      }
      else {
        datastring<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                   ,ctx);
        Result<wasm::WATParser::Ok>::Result
                  ((Result<wasm::WATParser::Ok> *)&err_2,
                   (Result<wasm::WATParser::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        local_218 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)&err_2);
        bVar1 = local_218 != (Err *)0x0;
        if (bVar1) {
          WATParser::Err::Err(&local_238,local_218);
          MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_238);
          WATParser::Err::~Err(&local_238);
        }
        Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)&err_2);
        if (!bVar1) {
          bVar1 = ParseInput::takeRParen(&ctx->in);
          if (bVar1) {
            wasm::Type::Type(&local_288,i32);
            Result<wasm::WATParser::Ok>::operator*
                      ((Result<wasm::WATParser::Ok> *)
                       ((long)&_val_2.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                       0x20));
            TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::
            getLimitsFromData(&ctx->
                               super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                             );
            TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>::makeMemType
                      (&ctx->
                        super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                       ,local_288.id,0);
            std::optional<wasm::WATParser::Ok>::operator=(&local_162,&local_27a);
            pOVar5 = Result<wasm::WATParser::Ok>::operator*
                               ((Result<wasm::WATParser::Ok> *)
                                ((long)&_val_2.val.
                                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                + 0x20));
            std::optional<wasm::WATParser::Ok>::operator=(&local_164,pOVar5);
            bVar1 = false;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"expected end of inline data",&local_279);
            ParseInput::err(&local_258,&ctx->in,&local_278);
            MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_258);
            WATParser::Err::~Err(&local_258);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator(&local_279);
            bVar1 = true;
          }
        }
        Result<wasm::WATParser::Ok>::~Result
                  ((Result<wasm::WATParser::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        if (!bVar1) goto LAB_01d21a9c;
      }
    }
    else {
      memtype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                ((Result<wasm::WATParser::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20),
                 ctx);
      Result<wasm::WATParser::Ok>::Result
                ((Result<wasm::WATParser::Ok> *)&err_3,
                 (Result<wasm::WATParser::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      pEVar4 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)&err_3);
      local_2e8 = pEVar4;
      if (pEVar4 != (Err *)0x0) {
        WATParser::Err::Err(&local_308,pEVar4);
        MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_308);
        WATParser::Err::~Err(&local_308);
      }
      Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)&err_3);
      if (pEVar4 == (Err *)0x0) {
        pOVar5 = Result<wasm::WATParser::Ok>::operator*
                           ((Result<wasm::WATParser::Ok> *)
                            ((long)&_val_3.val.
                                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                            + 0x20));
        std::optional<wasm::WATParser::Ok>::operator=(&local_162,pOVar5);
      }
      Result<wasm::WATParser::Ok>::~Result
                ((Result<wasm::WATParser::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      if (pEVar4 == (Err *)0x0) {
LAB_01d21a9c:
        bVar1 = ParseInput::takeRParen(&ctx->in);
        if (bVar1) {
          pvVar6 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                             ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                              ((long)&_val.val.
                                      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>
                              + 0x20));
          pIVar7 = MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::getPtr
                             ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
                              ((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                              + 0x20));
          std::optional<wasm::WATParser::Ok>::operator*(&local_162);
          ParseModuleTypesCtx::addMemory
                    (local_378,ctx,
                     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,name.super_IString.str._M_len,
                     pvVar6,pIVar7,IVar2);
          pEVar4 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)local_378);
          if (pEVar4 != (Err *)0x0) {
            WATParser::Err::Err((Err *)((long)&_val_5.val.
                                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                       + 0x20),pEVar4);
            MaybeResult<wasm::WATParser::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&_val_5.val.
                                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                              + 0x20));
            WATParser::Err::~Err
                      ((Err *)((long)&_val_5.val.
                                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                              + 0x20));
          }
          Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)local_378);
          if (pEVar4 == (Err *)0x0) {
            bVar1 = std::optional::operator_cast_to_bool((optional *)&local_164);
            if (bVar1) {
              pOVar5 = std::optional<wasm::WATParser::Ok>::operator*(&local_164);
              ParseModuleTypesCtx::addImplicitData((Result<wasm::WATParser::Ok> *)&err_5,ctx,pOVar5)
              ;
              local_3e8 = Result<wasm::WATParser::Ok>::getErr((Result<wasm::WATParser::Ok> *)&err_5)
              ;
              bVar1 = local_3e8 != (Err *)0x0;
              if (bVar1) {
                WATParser::Err::Err(&local_408,local_3e8);
                MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_408);
                WATParser::Err::~Err(&local_408);
              }
              Result<wasm::WATParser::Ok>::~Result((Result<wasm::WATParser::Ok> *)&err_5);
              if (bVar1) goto LAB_01d21e40;
            }
            MaybeResult<wasm::WATParser::Ok>::MaybeResult<wasm::WATParser::Ok>
                      (__return_storage_ptr__,&local_409);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"expected end of memory declaration",
                     (allocator<char> *)
                     ((long)&_val_4.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                     0x27));
          ParseInput::err(&local_328,&ctx->in,&local_348);
          MaybeResult<wasm::WATParser::Ok>::MaybeResult(__return_storage_ptr__,&local_328);
          WATParser::Err::~Err(&local_328);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&_val_4.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                     0x27));
        }
      }
    }
  }
LAB_01d21e40:
  MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::(anonymous_namespace)::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::(anonymous_namespace)::ImportNames,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x20));
LAB_01d21e5c:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::WATParser::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype = ctx.makeMemType(Type::i32, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtype(ctx);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}